

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O2

int Test_SUNLinSolInitialize(SUNLinearSolver S,int myid)

{
  int iVar1;
  
  iVar1 = SUNLinSolInitialize(S);
  if (iVar1 == 0) {
    if (myid != 0) {
      return 0;
    }
    puts("    PASSED test -- SUNLinSolInitialize ");
    iVar1 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolInitialize check, Proc %d \n",myid);
    iVar1 = 1;
  }
  if (print_time != 0) {
    printf("    SUNLinSolInitialize Time: %22.15e \n \n",0);
  }
  return iVar1;
}

Assistant:

int Test_SUNLinSolInitialize(SUNLinearSolver S, int myid)
{
  int       failure;
  double    start_time, stop_time;

  start_time = get_time(); 
  failure = SUNLinSolInitialize(S);
  stop_time = get_time(); 
  
  if (failure) {
    printf(">>> FAILED test -- SUNLinSolInitialize check, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolInitialize Time: %22.15e \n \n", stop_time - start_time);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolInitialize \n");
    PRINT_TIME("    SUNLinSolInitialize Time: %22.15e \n \n", stop_time - start_time);
  }    
  
  return(0);
}